

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iraffits.c
# Opt level: O0

char * irafrdhead(char *filename,int *lihead)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  uint *in_RSI;
  char *in_RDI;
  int nihead;
  long nbhead;
  char errmsg [81];
  char *irafheader;
  int nbr;
  FILE *fd;
  char local_88 [88];
  char *local_30;
  uint local_24;
  FILE *local_20;
  uint *local_18;
  char *local_8;
  
  *in_RSI = 0;
  local_18 = in_RSI;
  local_20 = fopen64(in_RDI,"rb");
  if (local_20 == (FILE *)0x0) {
    ffpmsg((char *)0x204df2);
    ffpmsg((char *)0x204dff);
    local_8 = (char *)0x0;
  }
  else {
    iVar1 = fseek(local_20,0,2);
    if (iVar1 == 0) {
      sVar3 = ftell(local_20);
      if ((long)sVar3 < 0) {
        ffpmsg((char *)0x204e75);
        ffpmsg((char *)0x204e82);
        local_8 = (char *)0x0;
      }
      else {
        iVar1 = fseek(local_20,0,0);
        if (iVar1 == 0) {
          uVar2 = (int)sVar3 + 5000;
          local_30 = (char *)calloc(1,(long)(int)uVar2);
          if (local_30 == (char *)0x0) {
            snprintf(local_88,0x51,"IRAFRHEAD Cannot allocate %d-byte header",(ulong)uVar2);
            ffpmsg((char *)0x204f23);
            ffpmsg((char *)0x204f30);
            local_8 = (char *)0x0;
          }
          else {
            *local_18 = uVar2;
            sVar3 = fread(local_30,1,sVar3,local_20);
            local_24 = (uint)sVar3;
            fclose(local_20);
            if ((int)local_24 < 0x400) {
              snprintf(local_88,0x51,"IRAFRHEAD header file: %d / %d bytes read.",(ulong)local_24,
                       0x400);
              ffpmsg((char *)0x204fac);
              ffpmsg((char *)0x204fb9);
              free(local_30);
              local_8 = (char *)0x0;
            }
            else {
              local_8 = local_30;
            }
          }
        }
        else {
          ffpmsg((char *)0x204eb4);
          ffpmsg((char *)0x204ec1);
          local_8 = (char *)0x0;
        }
      }
    }
    else {
      ffpmsg((char *)0x204e34);
      ffpmsg((char *)0x204e41);
      local_8 = (char *)0x0;
    }
  }
  return local_8;
}

Assistant:

static char *irafrdhead (
    const char *filename,  /* Name of IRAF header file */
    int *lihead)           /* Length of IRAF image header in bytes (returned) */
{
    FILE *fd;
    int nbr;
    char *irafheader;
    char errmsg[FLEN_ERRMSG];
    long nbhead;
    int nihead;

    *lihead = 0;

    /* open the image header file */
    fd = fopen (filename, "rb");
    if (fd == NULL) {
        ffpmsg("unable to open IRAF header file:");
        ffpmsg(filename);
	return (NULL);
	}

    /* Find size of image header file */
    if (fseek(fd, 0, 2) != 0)  /* move to end of the file */
    {
        ffpmsg("IRAFRHEAD: cannot seek in file:");
        ffpmsg(filename);
        return(NULL);
    }

    nbhead = ftell(fd);     /* position = size of file */
    if (nbhead < 0)
    {
        ffpmsg("IRAFRHEAD: cannot get pos. in file:");
        ffpmsg(filename);
        return(NULL);
    }

    if (fseek(fd, 0, 0) != 0) /* move back to beginning */
    {
        ffpmsg("IRAFRHEAD: cannot seek to beginning of file:");
        ffpmsg(filename);
        return(NULL);
    }

    /* allocate initial sized buffer */
    nihead = nbhead + 5000;
    irafheader = (char *) calloc (1, nihead);
    if (irafheader == NULL) {
	snprintf(errmsg, FLEN_ERRMSG,"IRAFRHEAD Cannot allocate %d-byte header",
		      nihead);
        ffpmsg(errmsg);
        ffpmsg(filename);
	return (NULL);
	}
    *lihead = nihead;

    /* Read IRAF header */
    nbr = fread (irafheader, 1, nbhead, fd);
    fclose (fd);

    /* Reject if header less than minimum length */
    if (nbr < LEN_PIXHDR) {
	snprintf(errmsg, FLEN_ERRMSG,"IRAFRHEAD header file: %d / %d bytes read.",
		      nbr,LEN_PIXHDR);
        ffpmsg(errmsg);
        ffpmsg(filename);
	free (irafheader);
	return (NULL);
	}

    return (irafheader);
}